

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_intra_chroma_pred_mode(bitstream *str,h264_cabac_context *cabac,uint32_t *val)

{
  uint32_t uVar1;
  h264_macroblock *phVar2;
  int condTermFlagB;
  int condTermFlagA;
  int ctxIdx [2];
  uint32_t *val_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  ctxIdx = (int  [2])val;
  if (cabac == (h264_cabac_context *)0x0) {
    str_local._4_4_ = vs_ue(str,val);
  }
  else {
    phVar2 = h264_mb_nb(cabac->slice,H264_MB_A,0);
    uVar1 = phVar2->intra_chroma_pred_mode;
    phVar2 = h264_mb_nb(cabac->slice,H264_MB_B,0);
    condTermFlagB = (uVar1 != 0) + 0x40 + (uint)(phVar2->intra_chroma_pred_mode != 0);
    condTermFlagA = 0x43;
    str_local._4_4_ = h264_cabac_tu(str,cabac,&condTermFlagB,2,3,(uint32_t *)ctxIdx);
  }
  return str_local._4_4_;
}

Assistant:

int h264_intra_chroma_pred_mode(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *val) {
	if (!cabac)
		return vs_ue(str, val);
	int ctxIdx[2];
	int condTermFlagA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->intra_chroma_pred_mode != 0;
	int condTermFlagB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->intra_chroma_pred_mode != 0;
	ctxIdx[0] = H264_CABAC_CTXIDX_INTRA_CHROMA_PRED_MODE + condTermFlagA + condTermFlagB;
	ctxIdx[1] = H264_CABAC_CTXIDX_INTRA_CHROMA_PRED_MODE + 3;
	return h264_cabac_tu(str, cabac, ctxIdx, 2, 3, val);
}